

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Performance::anon_unknown_1::ThresholdComparer<unsigned_long>::operator()
          (ThresholdComparer<unsigned_long> *this,unsigned_long *a,unsigned_long *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = (float)*a;
  fVar2 = (float)*b;
  fVar4 = fVar1 - fVar2;
  fVar3 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar3 = fVar4;
  }
  if ((float)this->absoluteThreshold < fVar3) {
    return (bool)(*a < *b &
                 -(fVar1 * this->relativeThreshold < fVar3) &
                 -(fVar2 * this->relativeThreshold < fVar3));
  }
  return false;
}

Assistant:

bool operator() (const T& a, const T& b) const
	{
		const float diff = de::abs((float)a - (float)b);

		// thresholds
		if (diff <= (float)absoluteThreshold)
			return false;
		if (diff <= float(a)*relativeThreshold ||
			diff <= float(b)*relativeThreshold)
			return false;

		// cmp
		return a < b;
	}